

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFontAtlas::GetTexDataAsAlpha8
          (ImFontAtlas *this,uchar **out_pixels,int *out_width,int *out_height,
          int *out_bytes_per_pixel)

{
  code *pcVar1;
  uchar *puVar2;
  
  puVar2 = this->TexPixelsAlpha8;
  if (puVar2 == (uchar *)0x0) {
    if ((this->ConfigData).Size == 0) {
      AddFontDefault(this,(ImFontConfig *)0x0);
    }
    if (this->FontBuilderIO == (ImFontBuilderIO *)0x0) {
      pcVar1 = ImFontAtlasBuildWithStbTruetype;
      ImFontAtlasGetBuilderForStbTruetype::io.FontBuilder_Build = ImFontAtlasBuildWithStbTruetype;
    }
    else {
      pcVar1 = this->FontBuilderIO->FontBuilder_Build;
    }
    (*pcVar1)(this);
    puVar2 = this->TexPixelsAlpha8;
  }
  *out_pixels = puVar2;
  if (out_width != (int *)0x0) {
    *out_width = this->TexWidth;
  }
  if (out_height != (int *)0x0) {
    *out_height = this->TexHeight;
  }
  if (out_bytes_per_pixel != (int *)0x0) {
    *out_bytes_per_pixel = 1;
  }
  return;
}

Assistant:

void    ImFontAtlas::GetTexDataAsAlpha8(unsigned char** out_pixels, int* out_width, int* out_height, int* out_bytes_per_pixel)
{
    // Build atlas on demand
    if (TexPixelsAlpha8 == NULL)
    {
        if (ConfigData.empty())
            AddFontDefault();
        Build();
    }

    *out_pixels = TexPixelsAlpha8;
    if (out_width) *out_width = TexWidth;
    if (out_height) *out_height = TexHeight;
    if (out_bytes_per_pixel) *out_bytes_per_pixel = 1;
}